

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::contextMenuEvent
          (QGraphicsProxyWidget *this,QGraphicsSceneContextMenuEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  bool bVar1;
  Reason RVar2;
  KeyboardModifiers KVar3;
  QWidget *pQVar4;
  QObject **ppQVar5;
  Data *pDVar6;
  QWeakPointer<QObject> *this_01;
  long in_FS_OFFSET;
  QPointF QVar7;
  QPoint globalPos;
  QContextMenuEvent contextMenuEvent;
  QPoint local_b8;
  QPoint local_b0;
  QWeakPointer<QObject> local_a8;
  QWeakPointer<QObject> local_98;
  QPointF local_88;
  QPoint local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event == (QGraphicsSceneContextMenuEvent *)0x0) goto LAB_0058f662;
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  this_01 = &(this_00->widget).wp;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_01);
  if (((!bVar1) || ((*(byte *)(*(long *)((this_00->widget).wp.value + 0x20) + 9) & 0x80) == 0)) ||
     (bVar1 = QGraphicsItem::hasFocus((QGraphicsItem *)(this + 0x10)), !bVar1)) goto LAB_0058f662;
  ppQVar5 = &(this_00->widget).wp.value;
  QVar7 = QGraphicsSceneContextMenuEvent::pos(event);
  local_88.yp = QVar7.yp;
  local_88.xp = QVar7.xp;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar6 = (((QPointer<QWidget> *)this_01)->wp).d;
  if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = (QWidget *)*ppQVar5;
  }
  local_78 = QPointF::toPoint(&local_88);
  pQVar4 = QWidget::childAt(pQVar4,&local_78);
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_98,pQVar4);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_98);
  if (bVar1) {
    this_01 = &local_98;
  }
  local_a8.d = this_01->d;
  if (bVar1) {
    ppQVar5 = &local_98.value;
  }
  local_a8.value = *ppQVar5;
  bVar1 = true;
  if (local_a8.d == (Data *)0x0) {
LAB_0058f4f2:
    pDVar6 = (Data *)0x0;
LAB_0058f4f5:
    pQVar4 = (QWidget *)0x0;
  }
  else {
    LOCK();
    *(int *)local_a8.d = *(int *)local_a8.d + 1;
    UNLOCK();
    if (local_a8.d == (Data *)0x0) goto LAB_0058f4f2;
    bVar1 = false;
    pQVar4 = (QWidget *)local_a8.value;
    pDVar6 = local_a8.d;
    if (*(int *)(local_a8.d + 4) == 0) goto LAB_0058f4f5;
  }
  QVar7 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_88,pQVar4);
  local_88.yp = QVar7.yp;
  local_88.xp = QVar7.xp;
  local_b0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  if (bVar1) {
    local_78 = QPointF::toPoint(&local_88);
    local_b0 = QWidget::mapToGlobal((QWidget *)0x0,&local_78);
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = (QWidget *)0x0;
    if (*(int *)(pDVar6 + 4) != 0) {
      pQVar4 = (QWidget *)local_a8.value;
    }
    local_78 = QPointF::toPoint(&local_88);
    local_b0 = QWidget::mapToGlobal(pQVar4,&local_78);
    pQVar4 = (QWidget *)0x0;
    if (*(int *)(pDVar6 + 4) != 0) {
      pQVar4 = (QWidget *)local_a8.value;
    }
  }
  for (; pQVar4 != (QWidget *)0x0; pQVar4 = *(QWidget **)(*(long *)&pQVar4->field_0x8 + 0x10)) {
    if (((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x20000000) != 0) {
      local_b0 = QGraphicsSceneContextMenuEvent::screenPos(event);
      break;
    }
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  RVar2 = QGraphicsSceneContextMenuEvent::reason(event);
  local_b8 = QPointF::toPoint(&local_88);
  KVar3 = QGraphicsSceneContextMenuEvent::modifiers(event);
  QContextMenuEvent::QContextMenuEvent
            ((QContextMenuEvent *)&local_78,RVar2,&local_b8,&local_b0,
             KVar3.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i);
  puStack_60 = (undefined1 *)QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  if ((bVar1) || (pQVar4 = (QWidget *)local_a8.value, *(int *)(pDVar6 + 4) == 0)) {
    pQVar4 = (QWidget *)0x0;
  }
  QCoreApplication::sendEvent(&pQVar4->super_QObject,(QEvent *)&local_78);
  (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,uStack_70._4_1_);
  QContextMenuEvent::~QContextMenuEvent((QContextMenuEvent *)&local_78);
  QWeakPointer<QObject>::~QWeakPointer(&local_a8);
  QWeakPointer<QObject>::~QWeakPointer(&local_98);
LAB_0058f662:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::contextMenuEvent(QGraphicsSceneContextMenuEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!event || !d->widget || !d->widget->isVisible() || !hasFocus())
        return;

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = d->widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : d->widget;

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    QPoint globalPos = receiver->mapToGlobal(pos.toPoint());
    //If the receiver by-pass the proxy its popups
    //will be top level QWidgets therefore they need
    //the screen position. mapToGlobal expect the widget to
    //have proper coordinates in regards of the windowing system
    //but it's not true because the widget is embedded.
    if (bypassGraphicsProxyWidget(receiver))
        globalPos = event->screenPos();

    // Send mouse event. ### Doesn't propagate the event.
    QContextMenuEvent contextMenuEvent(QContextMenuEvent::Reason(event->reason()),
                                       pos.toPoint(), globalPos, event->modifiers());
    contextMenuEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(receiver, &contextMenuEvent);

    event->setAccepted(contextMenuEvent.isAccepted());
}